

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_textedit_delete(nk_text_edit *state,int where,int len)

{
  nk_str *str;
  nk_text_edit *pnVar1;
  nk_rune *pnVar2;
  ulong uVar3;
  int len_1;
  nk_rune local_44;
  nk_text_edit *local_40;
  int local_34;
  
  local_40 = state;
  pnVar2 = nk_textedit_createundo(&state->undo,where,len,0);
  if (0 < len && pnVar2 != (nk_rune *)0x0) {
    str = &local_40->string;
    uVar3 = 0;
    do {
      local_44 = 0;
      nk_str_at_const(str,where + (int)uVar3,&local_44,&local_34);
      pnVar2[uVar3] = local_44;
      uVar3 = uVar3 + 1;
    } while ((uint)len != uVar3);
  }
  pnVar1 = local_40;
  nk_str_delete_runes(&local_40->string,where,len);
  pnVar1->has_preferred_x = '\0';
  return;
}

Assistant:

NK_API void
nk_textedit_delete(struct nk_text_edit *state, int where, int len)
{
    /* delete characters while updating undo */
    nk_textedit_makeundo_delete(state, where, len);
    nk_str_delete_runes(&state->string, where, len);
    state->has_preferred_x = 0;
}